

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O0

void __thiscall
QMetaCallEvent::QMetaCallEvent
          (QMetaCallEvent *this,ushort method_offset,ushort method_relative,
          StaticMetaCallFunction callFunction,QObject *sender,int signalId,int nargs)

{
  StaticMetaCallFunction in_RCX;
  ushort in_DX;
  ushort in_SI;
  QMetaCallEvent *in_RDI;
  int in_stack_00000008;
  QSemaphore *in_stack_ffffffffffffffa8;
  unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter> *this_00;
  QObject *in_stack_ffffffffffffffb8;
  
  this_00 = (unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter> *)0x0;
  QAbstractMetaCallEvent::QAbstractMetaCallEvent
            (&in_RDI->super_QAbstractMetaCallEvent,in_stack_ffffffffffffffb8,0,
             in_stack_ffffffffffffffa8);
  (in_RDI->super_QAbstractMetaCallEvent).super_QEvent._vptr_QEvent =
       (_func_int **)&PTR__QMetaCallEvent_00be7348;
  std::unique_ptr<QtPrivate::QSlotObjectBase,QtPrivate::QSlotObjectBase::Deleter>::
  unique_ptr<QtPrivate::QSlotObjectBase::Deleter,void>(this_00,in_stack_ffffffffffffffa8);
  (in_RDI->d).args_ = (void **)0x0;
  (in_RDI->d).callFunction_ = in_RCX;
  (in_RDI->d).nargs_ = in_stack_00000008;
  (in_RDI->d).method_offset_ = in_SI;
  (in_RDI->d).method_relative_ = in_DX;
  in_RDI->prealloc_[0x20] = '\0';
  in_RDI->prealloc_[0x21] = '\0';
  in_RDI->prealloc_[0x22] = '\0';
  in_RDI->prealloc_[0x23] = '\0';
  in_RDI->prealloc_[0x24] = '\0';
  in_RDI->prealloc_[0x25] = '\0';
  in_RDI->prealloc_[0x26] = '\0';
  in_RDI->prealloc_[0x27] = '\0';
  in_RDI->prealloc_[0x28] = '\0';
  in_RDI->prealloc_[0x29] = '\0';
  in_RDI->prealloc_[0x2a] = '\0';
  in_RDI->prealloc_[0x2b] = '\0';
  in_RDI->prealloc_[0x2c] = '\0';
  in_RDI->prealloc_[0x2d] = '\0';
  in_RDI->prealloc_[0x2e] = '\0';
  in_RDI->prealloc_[0x2f] = '\0';
  in_RDI->prealloc_[0x10] = '\0';
  in_RDI->prealloc_[0x11] = '\0';
  in_RDI->prealloc_[0x12] = '\0';
  in_RDI->prealloc_[0x13] = '\0';
  in_RDI->prealloc_[0x14] = '\0';
  in_RDI->prealloc_[0x15] = '\0';
  in_RDI->prealloc_[0x16] = '\0';
  in_RDI->prealloc_[0x17] = '\0';
  in_RDI->prealloc_[0x18] = '\0';
  in_RDI->prealloc_[0x19] = '\0';
  in_RDI->prealloc_[0x1a] = '\0';
  in_RDI->prealloc_[0x1b] = '\0';
  in_RDI->prealloc_[0x1c] = '\0';
  in_RDI->prealloc_[0x1d] = '\0';
  in_RDI->prealloc_[0x1e] = '\0';
  in_RDI->prealloc_[0x1f] = '\0';
  in_RDI->prealloc_[0] = '\0';
  in_RDI->prealloc_[1] = '\0';
  in_RDI->prealloc_[2] = '\0';
  in_RDI->prealloc_[3] = '\0';
  in_RDI->prealloc_[4] = '\0';
  in_RDI->prealloc_[5] = '\0';
  in_RDI->prealloc_[6] = '\0';
  in_RDI->prealloc_[7] = '\0';
  in_RDI->prealloc_[8] = '\0';
  in_RDI->prealloc_[9] = '\0';
  in_RDI->prealloc_[10] = '\0';
  in_RDI->prealloc_[0xb] = '\0';
  in_RDI->prealloc_[0xc] = '\0';
  in_RDI->prealloc_[0xd] = '\0';
  in_RDI->prealloc_[0xe] = '\0';
  in_RDI->prealloc_[0xf] = '\0';
  allocArgs(in_RDI);
  return;
}

Assistant:

QMetaCallEvent::QMetaCallEvent(ushort method_offset, ushort method_relative,
                               QObjectPrivate::StaticMetaCallFunction callFunction,
                               const QObject *sender, int signalId,
                               int nargs)
    : QAbstractMetaCallEvent(sender, signalId),
      d({nullptr, nullptr, callFunction, nargs, method_offset, method_relative}),
      prealloc_()
{
    allocArgs();
}